

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_vdpp_proc.cpp
# Opt level: O0

void set_dmsr_default_config(vdpp_api_params *p_api_params)

{
  vdpp_api_params *p_api_params_local;
  
  p_api_params->ptype = VDPP_PARAM_TYPE_DMSR;
  (p_api_params->param).dmsr.enable = true;
  (p_api_params->param).com.dfmt = 10;
  (p_api_params->param).com.dswap = 4;
  (p_api_params->param).com.src_width = 6;
  (p_api_params->param).com.src_height = 0xc;
  (p_api_params->param).com.dst_width = 0xc;
  (p_api_params->param).com.dst_height = 8;
  (p_api_params->param).dmsr.wgt_pri_gain_odd_2 = 0x10;
  (p_api_params->param).dmsr.wgt_sec_gain = 5;
  (p_api_params->param).dmsr.blk_flat_th = 0x14;
  (p_api_params->param).dmsr.contrast_to_conf_map_x0 = 0x690;
  (p_api_params->param).dmsr.contrast_to_conf_map_x1 = 0x1a40;
  (p_api_params->param).dmsr.contrast_to_conf_map_y0 = 0;
  (p_api_params->param).dmsr.contrast_to_conf_map_y1 = 0xffff;
  (p_api_params->param).dmsr.diff_core_th0 = 1;
  (p_api_params->param).dmsr.diff_core_th1 = 5;
  (p_api_params->param).dmsr.diff_core_wgt0 = 0x10;
  (p_api_params->param).dmsr.diff_core_wgt1 = 0x10;
  (p_api_params->param).dmsr.diff_core_wgt2 = 0x10;
  (p_api_params->param).dmsr.edge_th_low_arr[0] = 0x1e;
  (p_api_params->param).dmsr.edge_th_low_arr[1] = 10;
  (p_api_params->param).dmsr.edge_th_low_arr[2] = 0;
  (p_api_params->param).dmsr.edge_th_low_arr[3] = 0;
  (p_api_params->param).dmsr.edge_th_low_arr[4] = 0;
  (p_api_params->param).dmsr.edge_th_low_arr[5] = 0;
  (p_api_params->param).dmsr.edge_th_low_arr[6] = 0;
  (p_api_params->param).dmsr.edge_th_high_arr[0] = 0x3c;
  (p_api_params->param).dmsr.edge_th_high_arr[1] = 0x28;
  (p_api_params->param).dmsr.edge_th_high_arr[2] = 0x14;
  (p_api_params->param).dmsr.edge_th_high_arr[3] = 10;
  (p_api_params->param).dmsr.edge_th_high_arr[4] = 10;
  (p_api_params->param).dmsr.edge_th_high_arr[5] = 10;
  (p_api_params->param).dmsr.edge_th_high_arr[6] = 10;
  return;
}

Assistant:

static void set_dmsr_default_config(struct vdpp_api_params* p_api_params)
{
    p_api_params->ptype = VDPP_PARAM_TYPE_DMSR;
    p_api_params->param.dmsr.enable = 1;
    p_api_params->param.dmsr.str_pri_y = 10;
    p_api_params->param.dmsr.str_sec_y = 4;
    p_api_params->param.dmsr.dumping_y = 6;
    p_api_params->param.dmsr.wgt_pri_gain_even_1 = 12;
    p_api_params->param.dmsr.wgt_pri_gain_even_2 = 12;
    p_api_params->param.dmsr.wgt_pri_gain_odd_1 = 8;
    p_api_params->param.dmsr.wgt_pri_gain_odd_2 = 16;
    p_api_params->param.dmsr.wgt_sec_gain = 5;
    p_api_params->param.dmsr.blk_flat_th = 20;
    p_api_params->param.dmsr.contrast_to_conf_map_x0 = 1680;
    p_api_params->param.dmsr.contrast_to_conf_map_x1 = 6720;
    p_api_params->param.dmsr.contrast_to_conf_map_y0 = 0;
    p_api_params->param.dmsr.contrast_to_conf_map_y1 = 65535;
    p_api_params->param.dmsr.diff_core_th0 = 1;
    p_api_params->param.dmsr.diff_core_th1 = 5;
    p_api_params->param.dmsr.diff_core_wgt0 = 16;
    p_api_params->param.dmsr.diff_core_wgt1 = 16;
    p_api_params->param.dmsr.diff_core_wgt2 = 16;
    p_api_params->param.dmsr.edge_th_low_arr[0] = 30;
    p_api_params->param.dmsr.edge_th_low_arr[1] = 10;
    p_api_params->param.dmsr.edge_th_low_arr[2] = 0;
    p_api_params->param.dmsr.edge_th_low_arr[3] = 0;
    p_api_params->param.dmsr.edge_th_low_arr[4] = 0;
    p_api_params->param.dmsr.edge_th_low_arr[5] = 0;
    p_api_params->param.dmsr.edge_th_low_arr[6] = 0;
    p_api_params->param.dmsr.edge_th_high_arr[0] = 60;
    p_api_params->param.dmsr.edge_th_high_arr[1] = 40;
    p_api_params->param.dmsr.edge_th_high_arr[2] = 20;
    p_api_params->param.dmsr.edge_th_high_arr[3] = 10;
    p_api_params->param.dmsr.edge_th_high_arr[4] = 10;
    p_api_params->param.dmsr.edge_th_high_arr[5] = 10;
    p_api_params->param.dmsr.edge_th_high_arr[6] = 10;
}